

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

_Bool eval(ExprNode *en,char *hostname,uint port)

{
  _Bool _Var1;
  int iVar2;
  byte bVar3;
  size_t i;
  ulong uVar4;
  bool bVar5;
  
  bVar3 = 0;
  do {
    switch(en->op) {
    case OP_AND:
      goto switchD_0016037e_caseD_0;
    case OP_OR:
      uVar4 = 0;
      goto LAB_001603b4;
    case OP_NOT:
      en = (ExprNode *)(en->field_2).field_0.subexprs;
      bVar3 = bVar3 ^ 1;
      break;
    case OP_HOSTNAME_WC:
      iVar2 = wc_match((char *)(en->field_2).field_0.subexprs,hostname);
      bVar5 = iVar2 != 0;
      goto LAB_00160400;
    case OP_PORT_RANGE:
      if (port < (en->field_2).field_3.lo) {
        bVar5 = false;
      }
      else {
        bVar5 = port <= (en->field_2).field_3.hi;
      }
      goto LAB_00160400;
    default:
      __assert_fail("false && \"unhandled node type in eval\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                    ,0x253,"_Bool eval(ExprNode *, const char *, unsigned int)");
    }
  } while( true );
  while( true ) {
    _Var1 = eval((en->field_2).field_0.subexprs[uVar4],hostname,port);
    uVar4 = uVar4 + 1;
    if (_Var1) break;
LAB_001603b4:
    bVar5 = uVar4 < (en->field_2).field_0.nsubexprs;
    if (!bVar5) break;
  }
  goto LAB_00160400;
switchD_0016037e_caseD_0:
  uVar4 = 0;
  do {
    bVar5 = (en->field_2).field_0.nsubexprs <= uVar4;
    if (bVar5) break;
    _Var1 = eval((en->field_2).field_0.subexprs[uVar4],hostname,port);
    uVar4 = uVar4 + 1;
  } while (_Var1);
LAB_00160400:
  return (_Bool)(bVar3 ^ bVar5);
}

Assistant:

static bool eval(ExprNode *en, const char *hostname, unsigned port)
{
    switch (en->op) {
      case OP_AND:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (!eval(en->subexprs[i], hostname, port))
                return false;
        return true;

      case OP_OR:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (eval(en->subexprs[i], hostname, port))
                return true;
        return false;

      case OP_NOT:
        return !eval(en->subexpr, hostname, port);

      case OP_HOSTNAME_WC:
        return wc_match(en->wc, hostname);

      case OP_PORT_RANGE:
        return en->lo <= port && port <= en->hi;

      default:
        unreachable("unhandled node type in eval");
    }
}